

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  Blockchain A;
  string s;
  Block local_78;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,*argv,(allocator<char> *)&A);
  Blockchain::Blockchain(&A);
  poVar1 = std::operator<<((ostream *)&std::cout,"New block added");
  std::operator<<(poVar1,'\n');
  Block::Block(&local_78,1,&s);
  Blockchain::addBlock(&A,&local_78);
  Block::~Block(&local_78);
  std::__cxx11::_List_base<Block,_std::allocator<Block>_>::_M_clear
            (&A.offChain.super__List_base<Block,_std::allocator<Block>_>);
  std::__cxx11::string::~string((string *)&s);
  return 0;
}

Assistant:

int main(int argc, char* argv[]){
    string s = argv[0];
    Blockchain A = Blockchain();
    std::cout << "New block added"<<'\n';
    A.addBlock(Block(1,s));
    return 0;
}